

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::Set
          (RepeatedField<unsigned_long> *this,int index,unsigned_long *value)

{
  unsigned_long uVar1;
  LogMessage *pLVar2;
  unsigned_long *puVar3;
  LogFinisher local_aa;
  byte local_a9;
  LogMessage local_a8;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  unsigned_long *local_20;
  unsigned_long *value_local;
  RepeatedField<unsigned_long> *pRStack_10;
  int index_local;
  RepeatedField<unsigned_long> *this_local;
  
  local_59 = 0;
  local_20 = value;
  value_local._4_4_ = index;
  pRStack_10 = this;
  if (index < 0) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x29b);
    local_59 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_58,"CHECK failed: (index) >= (0): ");
    internal::LogFinisher::operator=(local_6d,pLVar2);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  local_a9 = 0;
  if (this->current_size_ <= value_local._4_4_) {
    internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x29c);
    local_a9 = 1;
    pLVar2 = internal::LogMessage::operator<<(&local_a8,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=(&local_aa,pLVar2);
  }
  if ((local_a9 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_a8);
  }
  uVar1 = *local_20;
  puVar3 = elements(this);
  puVar3[value_local._4_4_] = uVar1;
  return;
}

Assistant:

inline void RepeatedField<Element>::Set(int index, const Element& value) {
  GOOGLE_DCHECK_GE(index, 0);
  GOOGLE_DCHECK_LT(index, current_size_);
  elements()[index] = value;
}